

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFraigPartitioned(Vec_Ptr_t *vStore,void *pParams)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *vOuts;
  void *__ptr;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *__ptr_00;
  Abc_Frame_t *pAVar6;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar7;
  Vec_Ptr_t *vParts;
  void **ppvVar8;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pAVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong local_70;
  ulong local_60;
  
  if (vStore->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar10 = (Abc_Ntk_t *)*vStore->pArray;
  if (pAVar10->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x453,"Abc_Ntk_t *Abc_NtkFraigPartitioned(Vec_Ptr_t *, void *)");
  }
  ppvVar8 = (void **)0x0;
  __ptr_00 = Abc_NtkPartitionSmart(pAVar10,300,0);
  pAVar6 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar6,"unset progressbar");
  vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
  vOutsPtr->nCap = 1000;
  vOutsPtr->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  vOutsPtr->pArray = ppvVar7;
  uVar1 = __ptr_00->nSize;
  uVar13 = (ulong)uVar1;
  vParts = (Vec_Ptr_t *)malloc(0x10);
  local_60 = 8;
  if (6 < uVar1 - 1) {
    local_60 = (ulong)uVar1;
  }
  vParts->nSize = 0;
  iVar5 = (int)local_60;
  vParts->nCap = iVar5;
  if (iVar5 != 0) {
    ppvVar8 = (void **)malloc((long)iVar5 << 3);
  }
  vParts->pArray = ppvVar8;
  if ((int)uVar1 < 1) {
    local_70 = 0;
    printf(
          "                                                                                          \r"
          );
LAB_002ec7a1:
    ppvVar7 = __ptr_00->pArray;
    if (ppvVar7 != (void **)0x0) goto LAB_002ec7af;
  }
  else {
    uVar11 = 0;
    do {
      vOuts = (Vec_Int_t *)__ptr_00->pArray[uVar11];
      Abc_NtkConvertCos(pAVar10,vOuts,vOutsPtr);
      pNtkNew = Abc_NtkCreateConeArray(pAVar10,vOutsPtr,0);
      if (1 < vStore->nSize) {
        lVar12 = 1;
        do {
          pAVar9 = (Abc_Ntk_t *)vStore->pArray[lVar12];
          Abc_NtkConvertCos(pAVar9,vOuts,vOutsPtr);
          Abc_NtkAppendToCone(pNtkNew,pAVar9,vOutsPtr);
          lVar12 = lVar12 + 1;
        } while (lVar12 < vStore->nSize);
      }
      local_70 = uVar11 + 1;
      uVar2 = pNtkNew->vPis->nSize;
      iVar5 = pNtkNew->vPos->nSize;
      uVar3 = pNtkNew->nObjCounts[7];
      iVar4 = Abc_AigLevel(pNtkNew);
      printf("Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             local_70 & 0xffffffff,uVar13,(ulong)uVar2,iVar5,(ulong)uVar3,iVar4);
      pAVar9 = Abc_NtkFraig(pNtkNew,pParams,1,0);
      iVar5 = (int)local_60;
      if ((int)uVar11 == iVar5) {
        if (iVar5 < 0x10) {
          if (vParts->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vParts->pArray,0x80);
          }
          vParts->pArray = ppvVar7;
          vParts->nCap = 0x10;
          local_60 = 0x10;
        }
        else {
          local_60 = (ulong)(uint)(iVar5 * 2);
          if (vParts->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(local_60 * 8);
          }
          else {
            ppvVar7 = (void **)realloc(vParts->pArray,local_60 * 8);
          }
          vParts->pArray = ppvVar7;
          vParts->nCap = iVar5 * 2;
        }
      }
      else {
        ppvVar7 = vParts->pArray;
      }
      vParts->nSize = (int)local_70;
      ppvVar7[uVar11 & 0xffffffff] = pAVar9;
      Abc_NtkDelete(pNtkNew);
      uVar11 = local_70;
    } while (local_70 != uVar13);
    printf(
          "                                                                                          \r"
          );
    if ((int)uVar1 < 1) goto LAB_002ec7a1;
    ppvVar7 = __ptr_00->pArray;
    uVar11 = 0;
    do {
      __ptr = ppvVar7[uVar11];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
LAB_002ec7af:
    free(ppvVar7);
  }
  free(__ptr_00);
  pAVar6 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar6,"set progressbar");
  pAVar10 = Abc_NtkPartStitchChoices(pAVar10,vParts);
  ppvVar7 = vParts->pArray;
  if ((int)local_70 < 1) {
    if (ppvVar7 == (void **)0x0) goto LAB_002ec818;
  }
  else {
    uVar13 = 0;
    do {
      Abc_NtkDelete((Abc_Ntk_t *)ppvVar7[uVar13]);
      uVar13 = uVar13 + 1;
    } while ((local_70 & 0xffffffff) != uVar13);
  }
  free(ppvVar7);
LAB_002ec818:
  free(vParts);
  if (vOutsPtr->pArray != (void **)0x0) {
    free(vOutsPtr->pArray);
  }
  free(vOutsPtr);
  return pAVar10;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtk, * pNtk2, * pNtkAig, * pNtkFraig;
    int i, k;

    // perform partitioning
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // start the partition 
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        // add nodes to the partition
        Vec_PtrForEachEntryStart( Abc_Ntk_t *, vStore, pNtk2, k, 1 )
        {
            Abc_NtkConvertCos( pNtk2, vOne, vOnePtr );
            Abc_NtkAppendToCone( pNtkAig, pNtk2, vOnePtr );
        }
        printf( "Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pNtkAig), Abc_NtkPoNum(pNtkAig), 
            Abc_NtkNodeNum(pNtkAig), Abc_AigLevel(pNtkAig) );
        // fraig the partition
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 1, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    pNtkFraig = Abc_NtkPartStitchChoices( pNtk, vFraigs );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    return pNtkFraig;
}